

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O3

int ExtractAlpha_C(uint8_t *argb,int argb_stride,int width,int height,uint8_t *alpha,
                  int alpha_stride)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  
  if (0 < height) {
    bVar3 = 0xff;
    iVar4 = 0;
    do {
      if (0 < width) {
        uVar2 = 0;
        do {
          bVar1 = argb[uVar2 * 4];
          alpha[uVar2] = bVar1;
          bVar3 = bVar3 & bVar1;
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      argb = argb + argb_stride;
      alpha = alpha + alpha_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
    return (int)(bVar3 == 0xff);
  }
  return 1;
}

Assistant:

static int ExtractAlpha_C(const uint8_t* WEBP_RESTRICT argb, int argb_stride,
                          int width, int height,
                          uint8_t* WEBP_RESTRICT alpha, int alpha_stride) {
  uint8_t alpha_mask = 0xff;
  int i, j;

  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      const uint8_t alpha_value = argb[4 * i];
      alpha[i] = alpha_value;
      alpha_mask &= alpha_value;
    }
    argb += argb_stride;
    alpha += alpha_stride;
  }
  return (alpha_mask == 0xff);
}